

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_align.c
# Opt level: O0

void print_array_int(char *filename,int *array,char *s1,int s1Len,char *s2,int s2Len,
                    parasail_result_t *result)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  FILE *f;
  int local_38;
  int j;
  int i;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  int *array_local;
  char *filename_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    printf("fopen(\"%s\") error: %s\n",filename,pcVar3);
    exit(-1);
  }
  iVar1 = parasail_result_is_saturated(result);
  fprintf(__stream,"saturated=%d\n",(ulong)(iVar1 != 0));
  fprintf(__stream," ");
  for (f._4_4_ = 0; f._4_4_ < s2Len; f._4_4_ = f._4_4_ + 1) {
    fprintf(__stream,"%4c",(ulong)(uint)(int)s2[f._4_4_]);
  }
  fprintf(__stream,"\n");
  for (local_38 = 0; local_38 < s1Len; local_38 = local_38 + 1) {
    fprintf(__stream,"%c",(ulong)(uint)(int)s1[local_38]);
    for (f._4_4_ = 0; f._4_4_ < s2Len; f._4_4_ = f._4_4_ + 1) {
      fprintf(__stream,"%4d",(ulong)(uint)array[local_38 * s2Len + f._4_4_]);
    }
    fprintf(__stream,"\n");
  }
  fclose(__stream);
  return;
}

Assistant:

static void print_array_int(
        const char * filename,
        int * array,
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        parasail_result_t *result)
{
    int i;
    int j;
    FILE *f = NULL;

    f = fopen(filename, "w");
    if (NULL == f) {
        printf("fopen(\"%s\") error: %s\n", filename, strerror(errno));
        exit(-1);
    }
    fprintf(f, "saturated=%d\n", parasail_result_is_saturated(result) ? 1 : 0);
    fprintf(f, " ");
    for (j=0; j<s2Len; ++j) {
        fprintf(f, "%4c", s2[j]);
    }
    fprintf(f, "\n");
    for (i=0; i<s1Len; ++i) {
        fprintf(f, "%c", s1[i]);
        for (j=0; j<s2Len; ++j) {
            fprintf(f, "%4d", array[i*s2Len + j]);
        }
        fprintf(f, "\n");
    }
    fclose(f);
}